

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void std::allocator_traits<std::allocator<glcts::(anonymous_namespace)::UniformType>>::
     construct<glcts::(anonymous_namespace)::UniformType,glcts::(anonymous_namespace)::UniformType>
               (allocator_type *__a,UniformType *__p,UniformType *__args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pair<int,_int> pVar3;
  pointer piVar4;
  pointer pUVar5;
  undefined8 uVar6;
  
  *(GLenum *)__a = __p->enumType;
  piVar4 = (__p->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)(__a + 8) =
       (__p->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(__a + 0x10) = piVar4;
  *(pointer *)(__a + 0x18) =
       (__p->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__p->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(int *)(__a + 0x20) = __p->arraySize;
  pUVar5 = (__p->childTypes).
           super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(__a + 0x28) =
       (__p->childTypes).
       super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(__a + 0x30) = pUVar5;
  *(pointer *)(__a + 0x38) =
       (__p->childTypes).
       super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__p->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(allocator_type **)(__a + 0x40) = __a + 0x50;
  pcVar2 = (__p->strType)._M_dataplus._M_p;
  paVar1 = &(__p->strType).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar6 = *(undefined8 *)((long)&(__p->strType).field_2 + 8);
    *(size_type *)(__a + 0x50) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(__a + 0x58) = uVar6;
  }
  else {
    *(pointer *)(__a + 0x40) = pcVar2;
    *(size_type *)(__a + 0x50) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(__a + 0x48) = (__p->strType)._M_string_length;
  (__p->strType)._M_dataplus._M_p = (pointer)paVar1;
  (__p->strType)._M_string_length = 0;
  (__p->strType).field_2._M_local_buf[0] = '\0';
  *(allocator_type **)(__a + 0x60) = __a + 0x70;
  pcVar2 = (__p->refStrType)._M_dataplus._M_p;
  paVar1 = &(__p->refStrType).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar6 = *(undefined8 *)((long)&(__p->refStrType).field_2 + 8);
    *(size_type *)(__a + 0x70) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(__a + 0x78) = uVar6;
  }
  else {
    *(pointer *)(__a + 0x60) = pcVar2;
    *(size_type *)(__a + 0x70) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(__a + 0x68) = (__p->refStrType)._M_string_length;
  (__p->refStrType)._M_dataplus._M_p = (pointer)paVar1;
  (__p->refStrType)._M_string_length = 0;
  (__p->refStrType).field_2._M_local_buf[0] = '\0';
  pVar3 = __p->size;
  *(undefined8 *)(__a + 0x86) = *(undefined8 *)((long)&(__p->size).second + 2);
  *(pair<int,_int> *)(__a + 0x80) = pVar3;
  return;
}

Assistant:

UniformType(GLenum _enumType, int _arraySize = 0)
		: enumType(_enumType), arraySize(_arraySize), isArray(_arraySize > 0), signedType(true)
	{
		if (!arraySize)
		{
			arraySize = 1;
		}
		arraySizesSegmented.push_back(arraySize);
		fill();
	}